

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

void fert_stats<dynet::AttentionalModel<dynet::LSTMBuilder>>
               (Model *model,AttentionalModel<dynet::LSTMBuilder> *am,Corpus *devel,bool global_fert
               )

{
  pointer ptVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  int docid;
  int *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  Sentence tsent;
  Sentence ssent;
  
  ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,global_fert) != 0) {
    std::operator<<((ostream *)&std::cout,"==== FERTILITY ESTIMATES ====\n");
    uVar3 = 0;
    while( true ) {
      ptVar1 = (devel->
               super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(devel->
                         super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1) / 0x38) <=
          (ulong)uVar3) break;
      local_80 = &docid;
      local_78 = &tsent;
      local_70 = &ssent;
      std::
      _Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
      ::_M_assign<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
                  *)&local_80,
                 &ptVar1[uVar3].
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                );
      poVar2 = std::operator<<((ostream *)&std::cout,"=== sentence ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,docid);
      std::operator<<(poVar2,") ===\n");
      dynet::AttentionalModel<dynet::LSTMBuilder>::display_fertility(am,&ssent,&sd);
      uVar3 = uVar3 + 1;
    }
  }
  std::operator<<((ostream *)&std::cout,"==== EMPIRICAL FERTILITY VALUES ====\n");
  uVar3 = 0;
  while( true ) {
    ptVar1 = (devel->
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(devel->
                       super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1) / 0x38) <=
        (ulong)uVar3) break;
    local_80 = &docid;
    local_78 = &tsent;
    local_70 = &ssent;
    std::
    _Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
    ::_M_assign<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
              ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
                *)&local_80,
               &ptVar1[uVar3].
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
              );
    poVar2 = std::operator<<((ostream *)&std::cout,"=== sentence ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,docid);
    std::operator<<(poVar2,") ===\n");
    dynet::AttentionalModel<dynet::LSTMBuilder>::display_empirical_fertility(am,&ssent,&tsent,&sd);
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tsent.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ssent.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void fert_stats(Model &model, AM_t &am, Corpus &devel, bool global_fert)
{
    Sentence ssent, tsent;
    int docid;

    if (global_fert) {
        std::cout << "==== FERTILITY ESTIMATES ====\n";
        for (unsigned i = 0; i < devel.size(); ++i) {
            tie(ssent, tsent, docid) = devel[i];
            std::cout << "=== sentence " << i << " (" << docid << ") ===\n";
            am.display_fertility(ssent, sd);
        }
    }

    std::cout << "==== EMPIRICAL FERTILITY VALUES ====\n";
    for (unsigned i = 0; i < devel.size(); ++i) {
        tie(ssent, tsent, docid) = devel[i];
        std::cout << "=== sentence " << i << " (" << docid << ") ===\n";
        am.display_empirical_fertility(ssent, tsent, sd);
    }
}